

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void run_container_union_inplace(run_container_t *src_1,run_container_t *src_2)

{
  rle16_t *prVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  rle16_t rVar5;
  rle16_t rVar6;
  rle16_t *prVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  
  iVar4 = src_1->n_runs;
  bVar16 = false;
  if ((iVar4 == 1) && (bVar16 = false, src_1->runs->value == 0)) {
    bVar16 = src_1->runs->length == 0xffff;
  }
  bVar17 = false;
  if ((src_2->n_runs == 1) && (bVar17 = false, src_2->runs->value == 0)) {
    bVar17 = src_2->runs->length == 0xffff;
  }
  if ((bool)(bVar16 | bVar17)) {
    if (bVar16) {
      return;
    }
    if (bVar17) {
      run_container_copy(src_2,src_1);
      return;
    }
  }
  iVar8 = src_2->n_runs + iVar4;
  if (src_1->capacity < iVar4 + iVar8) {
    run_container_grow(src_1,iVar4 + iVar8,true);
  }
  memmove(src_1->runs + iVar8,src_1->runs,(long)src_1->n_runs << 2);
  prVar1 = src_1->runs + iVar8;
  iVar4 = src_1->n_runs;
  src_1->n_runs = 0;
  uVar2 = src_2->runs->value;
  uVar3 = prVar1->value;
  uVar9 = (ulong)(uVar3 <= uVar2);
  uVar15 = (uint)(uVar3 <= uVar2);
  prVar7 = src_2->runs;
  if (uVar3 <= uVar2) {
    prVar7 = prVar1;
  }
  uVar12 = (ulong)(uVar2 < uVar3);
  rVar6 = *prVar7;
  *src_1->runs = rVar6;
  src_1->n_runs = src_1->n_runs + 1;
  uVar10 = (uint)rVar6 >> 0x10;
  uVar11 = (uint)(uVar2 < uVar3);
  if ((int)uVar15 < iVar4 && (int)uVar11 < src_2->n_runs) {
    do {
      uVar2 = prVar1[uVar9].value;
      uVar3 = src_2->runs[uVar12].value;
      prVar7 = prVar1 + uVar9;
      if (uVar3 < uVar2) {
        prVar7 = src_2->runs + uVar12;
      }
      rVar5 = *prVar7;
      uVar15 = (uint)rVar6 & 0xffff;
      if (uVar15 + (uVar10 & 0xffff) + 1 < ((uint)rVar5 & 0xffff)) {
        prVar7 = src_1->runs;
        iVar8 = src_1->n_runs;
        prVar7[iVar8].value = rVar5.value;
        prVar7[iVar8].length = rVar5.length;
        src_1->n_runs = iVar8 + 1;
        rVar6 = rVar5;
        uVar10 = (uint)rVar5 >> 0x10;
      }
      else {
        uVar11 = ((uint)rVar5 & 0xffff) + ((uint)rVar5 >> 0x10);
        if ((uVar10 & 0xffff) + uVar15 <= uVar11) {
          uVar10 = uVar11 - uVar15;
          src_1->runs[(long)src_1->n_runs + -1] = (rle16_t)(uVar10 * 0x10000 | uVar15);
        }
      }
      uVar11 = (int)uVar12 + (uint)(uVar3 < uVar2);
      uVar12 = (ulong)uVar11;
      uVar15 = (int)uVar9 + (uint)(uVar2 <= uVar3);
      uVar9 = (ulong)uVar15;
    } while (((int)uVar11 < src_2->n_runs) && ((int)uVar15 < iVar4));
  }
  if ((int)uVar11 < src_2->n_runs) {
    lVar13 = (long)(int)uVar11;
    do {
      rVar5 = src_2->runs[lVar13];
      uVar11 = (uint)rVar6 & 0xffff;
      if (uVar11 + (uVar10 & 0xffff) + 1 < ((uint)rVar5 & 0xffff)) {
        prVar7 = src_1->runs;
        iVar8 = src_1->n_runs;
        prVar7[iVar8].value = rVar5.value;
        prVar7[iVar8].length = rVar5.length;
        src_1->n_runs = iVar8 + 1;
        rVar6 = rVar5;
        uVar10 = (uint)rVar5 >> 0x10;
      }
      else {
        uVar14 = ((uint)rVar5 & 0xffff) + ((uint)rVar5 >> 0x10);
        if ((uVar10 & 0xffff) + uVar11 <= uVar14) {
          uVar10 = uVar14 - uVar11;
          src_1->runs[(long)src_1->n_runs + -1] = (rle16_t)(uVar10 * 0x10000 | uVar11);
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < src_2->n_runs);
  }
  if ((int)uVar15 < iVar4) {
    lVar13 = (long)(int)uVar15;
    do {
      rVar5 = prVar1[lVar13];
      uVar15 = (uint)rVar6 & 0xffff;
      if (uVar15 + (uVar10 & 0xffff) + 1 < ((uint)rVar5 & 0xffff)) {
        prVar7 = src_1->runs;
        iVar8 = src_1->n_runs;
        prVar7[iVar8].value = rVar5.value;
        prVar7[iVar8].length = rVar5.length;
        src_1->n_runs = iVar8 + 1;
        rVar6 = rVar5;
        uVar10 = (uint)rVar5 >> 0x10;
      }
      else {
        uVar11 = ((uint)rVar5 & 0xffff) + ((uint)rVar5 >> 0x10);
        if ((uVar10 & 0xffff) + uVar15 <= uVar11) {
          uVar10 = uVar11 - uVar15;
          src_1->runs[(long)src_1->n_runs + -1] = (rle16_t)(uVar10 * 0x10000 | uVar15);
        }
      }
      lVar13 = lVar13 + 1;
    } while (iVar4 != lVar13);
  }
  return;
}

Assistant:

void run_container_union_inplace(run_container_t *src_1,
                                 const run_container_t *src_2) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return;
        }
        if (if2) {
            run_container_copy(src_2, src_1);
            return;
        }
    }
    // we move the data to the end of the current array
    const int32_t maxoutput = src_1->n_runs + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_1->n_runs;
    if (src_1->capacity < neededcapacity)
        run_container_grow(src_1, neededcapacity, true);
    memmove(src_1->runs + maxoutput, src_1->runs,
            src_1->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc1 = src_1->runs + maxoutput;
    const int32_t input1nruns = src_1->n_runs;
    src_1->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(src_1, inputsrc1[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(src_1, src_2->runs[xrlepos]);
        xrlepos++;
    }
    while ((xrlepos < src_2->n_runs) && (rlepos < input1nruns)) {
        rle16_t newrl;
        if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = inputsrc1[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(src_1, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(src_1, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < input1nruns) {
        run_container_append(src_1, inputsrc1[rlepos], &previousrle);
        rlepos++;
    }
}